

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

Error uv11::write2(WriteRequest *req,Stream *stream,Buffer *bufs,uint nbufs,Stream *send_handle,
                  WriteCb *write_cb)

{
  int s;
  Error EVar2;
  error_category *peVar3;
  error_code eVar1;
  
  std::function<void_(uv11::WriteRequest_&,_std::error_code)>::operator=(&req->write_cb,write_cb);
  s = uv_write2(req,stream->stream_ptr,bufs,nbufs,send_handle->stream_ptr,
                write2::anon_class_1_0_00000001::__invoke);
  if (s != 0) {
    std::function<void_(uv11::WriteRequest_&,_std::error_code)>::operator=
              (&req->write_cb,(nullptr_t)0x0);
  }
  eVar1 = make_error(s);
  EVar2._M_value = eVar1._M_value;
  EVar2._4_4_ = eVar1._4_4_;
  register0x00000010 = eVar1._M_cat;
  return EVar2;
}

Assistant:

Error uv11::write2(WriteRequest& req, Stream& stream, Buffer const bufs[], unsigned int nbufs,
    Stream& send_handle, WriteCb const& write_cb)
{
    req.write_cb = write_cb;
    int s = uv_write2(
        &req.Get(),
        &stream.GetStream(),
        bufs, nbufs,
        &send_handle.GetStream(),
        [] (uv_write_t* r, int status) {
            WriteRequest* w = reinterpret_cast<WriteRequest*>(r->data);
            auto w_cb = w->write_cb;
            w->write_cb = nullptr;
            w_cb(*w, make_error(status));
        }
    );

    if (s) req.write_cb = nullptr;

    return make_error(s);
}